

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Printer *p)

{
  cpp *this_00;
  TailCallTableInfo *pTVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  size_type in_RCX;
  Options *options;
  long lVar5;
  Span<const_google::protobuf::FieldDescriptor_*const> field_descriptors;
  allocator<char> local_a1b;
  allocator<char> local_a1a;
  allocator<char> local_a19;
  allocator<char> local_a18;
  allocator<char> local_a17;
  allocator<char> local_a16;
  allocator<char> local_a15;
  allocator<char> local_a14;
  allocator<char> local_a13;
  allocator<char> local_a12;
  allocator<char> local_a11;
  Printer *p_local;
  _Any_data local_a08;
  code *local_9f8;
  code *pcStack_9f0;
  undefined1 *local_9e0;
  undefined8 local_9d8;
  undefined1 local_9d0 [8];
  undefined8 uStack_9c8;
  undefined1 *local_9c0;
  undefined8 local_9b8;
  undefined1 local_9b0 [8];
  undefined8 uStack_9a8;
  undefined1 *local_9a0;
  undefined8 local_998;
  undefined1 local_990 [8];
  undefined8 uStack_988;
  undefined1 *local_980;
  undefined8 local_978;
  undefined1 local_970 [8];
  undefined8 uStack_968;
  undefined1 *local_960;
  undefined8 local_958;
  undefined1 local_950 [8];
  undefined8 uStack_948;
  Printer *local_940;
  int local_938;
  int local_934;
  anon_class_16_2_fd512ddd_for_cb_conflict2 GenerateAuxEntries;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  string local_910;
  string local_8f0;
  unsigned_long local_8d0;
  string local_8c8;
  unsigned_long local_8a8;
  string local_8a0;
  string local_880;
  char *local_860;
  string local_858;
  NumToEntryTable field_num_to_entry_table;
  Sub local_818 [4];
  Sub local_538;
  Sub local_480;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  variant<std::__cxx11::string,std::function<bool()>> local_3a8 [32];
  char local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  variant<std::__cxx11::string,std::function<bool()>> local_2f0 [32];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  variant<std::__cxx11::string,std::function<bool()>> local_238 [32];
  char local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            (&v,p,&this->variables_);
  this_00 = (cpp *)(this->ordered_fields_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  field_descriptors.ptr_ =
       (pointer)((long)(this->ordered_fields_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3);
  field_descriptors.len_ = in_RCX;
  MakeNumToEntryTable(&field_num_to_entry_table,this_00,field_descriptors);
  GenerateAuxEntries.p = &p_local;
  GenerateAuxEntries.this = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"const",&local_a11);
  bVar4 = IsFileDescriptorProto
                    ((cpp *)this->descriptor_->file_,(FileDescriptor *)this->options_,options);
  local_860 = "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst";
  if (bVar4) {
    local_860 = "constexpr";
  }
  io::Printer::Sub::Sub<char_const*>(local_818,&local_858,&local_860);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"table_size_log2",&local_a12);
  io::Printer::Sub::Sub<int&>
            (local_818 + 1,&local_880,
             &((this->tc_table_info_)._M_t.
               super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
              _M_head_impl)->table_size_log2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"ordered_size",&local_a13)
  ;
  local_8a8 = (long)(this->ordered_fields_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->ordered_fields_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  io::Printer::Sub::Sub<unsigned_long>(local_818 + 2,&local_8a0,&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"aux_size",&local_a14);
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  local_8d0 = (long)*(pointer *)
                     ((long)&(pTVar1->aux_entries).
                             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     + 8) -
              *(long *)&(pTVar1->aux_entries).
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                        ._M_impl >> 4;
  io::Printer::Sub::Sub<unsigned_long>(local_818 + 3,&local_8c8,&local_8d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"data_size",&local_a15);
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  puVar2 = *(pointer *)
            &(pTVar1->field_name_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&(pTVar1->field_name_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8);
  local_934 = 0;
  if (puVar3 != puVar2) {
    local_934 = ((int)puVar3 - (int)puVar2) + 1;
  }
  io::Printer::Sub::Sub<int>(&local_538,&local_8f0,&local_934);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"field_num_to_entry_table_size",&local_a16);
  local_938 = NumToEntryTable::size16(&field_num_to_entry_table);
  io::Printer::Sub::Sub<int>(&local_480,&local_910,&local_938);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"table_base",&local_a17);
  local_3c8 = local_3b8;
  if (local_960 == local_950) {
    uStack_3b0 = uStack_948;
  }
  else {
    local_3c8 = local_960;
  }
  local_3c0 = local_958;
  local_958 = 0;
  local_950[0] = 0;
  local_9f8 = (code *)0x0;
  pcStack_9f0 = (code *)0x0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_960 = local_950;
  local_940 = p;
  local_a08._M_unused._M_object = operator_new(0x20);
  *(Printer ***)local_a08._M_unused._0_8_ = &p_local;
  *(ParseFunctionGenerator **)((long)local_a08._M_unused._0_8_ + 8) = this;
  *(NumToEntryTable **)((long)local_a08._M_unused._0_8_ + 0x10) = &field_num_to_entry_table;
  *(code *)((long)local_a08._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_9f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_3a8,(function<bool_()> *)&local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  if (local_388 == '\x01') {
    std::__cxx11::string::assign((char *)&local_380);
  }
  local_318 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"fast_entries",&local_a18)
  ;
  local_310 = local_300;
  if (local_980 == local_970) {
    uStack_2f8 = uStack_968;
  }
  else {
    local_310 = local_980;
  }
  local_308 = local_978;
  local_978 = 0;
  local_970[0] = 0;
  local_9f8 = (code *)0x0;
  pcStack_9f0 = (code *)0x0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_980 = local_970;
  local_a08._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_a08._M_unused._0_8_ = &p_local;
  *(ParseFunctionGenerator **)((long)local_a08._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_a08._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_2f0,(function<bool_()> *)&local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  if (local_2d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_2c8);
  }
  local_260 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"field_lookup_table",&local_a19);
  local_258 = local_248;
  if (local_9a0 == local_990) {
    uStack_240 = uStack_988;
  }
  else {
    local_258 = local_9a0;
  }
  local_250 = local_998;
  local_998 = 0;
  local_990[0] = 0;
  local_9f8 = (code *)0x0;
  pcStack_9f0 = (code *)0x0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_9a0 = local_990;
  local_a08._M_unused._M_object = operator_new(0x18);
  *(NumToEntryTable **)local_a08._M_unused._0_8_ = &field_num_to_entry_table;
  *(Printer ***)((long)local_a08._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_a08._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_238,(function<bool_()> *)&local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  if (local_218 == '\x01') {
    std::__cxx11::string::assign((char *)&local_210);
  }
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"field_and_aux_entries",&local_a1a);
  local_1a0 = local_190;
  if (local_9c0 == local_9b0) {
    uStack_188 = uStack_9a8;
  }
  else {
    local_1a0 = local_9c0;
  }
  local_198 = local_9b8;
  local_9b8 = 0;
  local_9b0[0] = 0;
  local_9f8 = (code *)0x0;
  pcStack_9f0 = (code *)0x0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_9c0 = local_9b0;
  local_a08._M_unused._M_object = operator_new(0x20);
  *(ParseFunctionGenerator **)local_a08._M_unused._0_8_ = this;
  *(Printer ***)((long)local_a08._M_unused._0_8_ + 8) = &p_local;
  *(anon_class_16_2_fd512ddd_for_cb_conflict2 **)((long)local_a08._M_unused._0_8_ + 0x10) =
       &GenerateAuxEntries;
  *(code *)((long)local_a08._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_9f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_180,(function<bool_()> *)&local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"field_names",&local_a1b);
  local_e8 = local_d8;
  if (local_9e0 == local_9d0) {
    uStack_d0 = uStack_9c8;
  }
  else {
    local_e8 = local_9e0;
  }
  local_e0 = local_9d8;
  local_9d8 = 0;
  local_9d0[0] = 0;
  local_9f8 = (code *)0x0;
  pcStack_9f0 = (code *)0x0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_9e0 = local_9d0;
  local_a08._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_a08._M_unused._0_8_ = &p_local;
  *(ParseFunctionGenerator **)((long)local_a08._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_a08._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_9f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_a08);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(local_940,local_818,0xb,0x126,
                    "\n$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>\n$classname$::_table_ = {\n  {\n    $table_base$\n  }, {{\n    $fast_entries$\n  }}, {{\n    $field_lookup_table$\n  }}, $field_and_aux_entries$,\n  {{\n    $field_names$,\n  }},\n};\n"
                   );
  lVar5 = 0x730;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_818[0].key_._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != -0xb8);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_858);
  std::
  vector<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
  ::~vector(&field_num_to_entry_table.blocks);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup(&v);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(io::Printer* p) {
  auto v = p->WithVars(variables_);
  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  NumToEntryTable field_num_to_entry_table =
      MakeNumToEntryTable(ordered_fields_);

  auto GenerateTableBase = [&] {
    p->Emit(
        {{"has_bits_offset",
          [&] {
            if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
              p->Emit(
                  "PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_),\n");
            } else {
              p->Emit("0,  // no _has_bits_\n");
            }
          }},
         {"extension_offset",
          [&] {
            if (descriptor_->extension_range_count() != 0) {
              p->Emit("PROTOBUF_FIELD_OFFSET($classname$, $extensions$),\n");
            } else {
              p->Emit("0, // no _extensions_\n");
            }
          }},
         {"max_field_number",
          ordered_fields_.empty() ? 0 : ordered_fields_.back()->number()},
         {"fast_idx_mask", (((1 << tc_table_info_->table_size_log2) - 1) << 3)},
         {"skipmap32", field_num_to_entry_table.skipmap32},
         {"field_entries_offset",
          [&] {
            if (ordered_fields_.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no field_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_entries),
              )cc");
            }
          }},
         {"num_field_entries", ordered_fields_.size()},
         {"num_aux_entries", tc_table_info_->aux_entries.size()},
         {"aux_offset",
          [&] {
            if (tc_table_info_->aux_entries.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no aux_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), aux_entries),
              )cc");
            }
          }},
         {"class_data", [&] { p->Emit("$classname$_class_data_.base(),\n"); }},
         {"post_loop_handler",
          [&] {
            if (NeedsPostLoopHandler(descriptor_, options_)) {
              p->Emit("&$classname$::PostLoopHandler,\n");
            } else {
              p->Emit("nullptr,  // post_loop_handler\n");
            }
          }},
         {"fallback", TcParseFunctionName(tc_table_info_->fallback_function)},
         {"to_prefetch",
          [&] {
            std::vector<const FieldDescriptor*> subtable_fields;
            for (const auto& aux : tc_table_info_->aux_entries) {
              if (aux.type == internal::TailCallTableInfo::kSubTable) {
                subtable_fields.push_back(aux.field);
              }
            }
            const auto* hottest = FindHottestField(subtable_fields, options_);
            p->Emit(
                {{"hot_type", QualifiedClassName(hottest == nullptr
                                                     ? descriptor_
                                                     : hottest->message_type(),
                                                 options_)}},
                R"cc(
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
                  ::_pbi::TcParser::GetTable<$hot_type$>(),  // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE)cc");
          }}},
        // clang-format off
        R"cc(
        $has_bits_offset$,
        $extension_offset$,
        $max_field_number$, $fast_idx_mask$,  // max_field_number, fast_idx_mask
        offsetof(decltype(_table_), field_lookup_table),
        $skipmap32$,  // skipmap
        $field_entries_offset$,
        $num_field_entries$,  // num_field_entries
        $num_aux_entries$,  // num_aux_entries
        $aux_offset$,
        $class_data$,
        $post_loop_handler$,
        $fallback$,  // fallback
        $to_prefetch$)cc"
        // clang-format on
    );
  };

  auto GenerateAuxEntries = [&] {
    for (const auto& aux_entry : tc_table_info_->aux_entries) {
      switch (aux_entry.type) {
        case TailCallTableInfo::kNothing:
          p->Emit("{},\n");
          break;
        case TailCallTableInfo::kInlinedStringDonatedOffset:
          p->Emit(
              "{_fl::Offset{offsetof($classname$, "
              "_impl_._inlined_string_donated_)}},\n");
          break;
        case TailCallTableInfo::kSplitOffset:
          p->Emit("{_fl::Offset{offsetof($classname$, _impl_._split_)}},\n");
          break;
        case TailCallTableInfo::kSplitSizeof:
          p->Emit("{_fl::Offset{sizeof($classname$::Impl_::Split)}},\n");
          break;
        case TailCallTableInfo::kSubMessage:
          p->Emit({{"name", QualifiedDefaultInstanceName(
                                aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$name$},\n");
          break;
        case TailCallTableInfo::kSubTable:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{::_pbi::TcParser::GetTable<$name$>()},\n");
          break;
        case TailCallTableInfo::kSubMessageWeak:
          p->Emit({{"ptr", QualifiedDefaultInstancePtr(
                               aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$ptr$},\n");
          break;
        case TailCallTableInfo::kMessageVerifyFunc:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{$name$::InternalVerify},\n");
          break;
        case TailCallTableInfo::kSelfVerifyFunc:
          if (ShouldVerify(descriptor_, options_, scc_analyzer_)) {
            p->Emit("{&InternalVerify},\n");
          } else {
            p->Emit("{},\n");
          }
          break;
        case TailCallTableInfo::kEnumRange:
          p->Emit(
              {
                  {"first", aux_entry.enum_range.first},
                  {"last", aux_entry.enum_range.last},
              },
              "{$first$, $last$},\n");
          break;
        case TailCallTableInfo::kEnumValidator:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->enum_type(),
                                               options_)}},
                  "{::_pbi::FieldAuxEnumData{}, $name$_internal_data_},\n");
          break;
        case TailCallTableInfo::kNumericOffset:
          p->Emit(
              {
                  {"offset", aux_entry.offset},
              },
              "{_fl::Offset{$offset$}},\n");
          break;
        case TailCallTableInfo::kMapAuxInfo: {
          auto utf8_check = internal::cpp::GetUtf8CheckMode(
              aux_entry.field,
              GetOptimizeFor(aux_entry.field->file(), options_) ==
                  FileOptions::LITE_RUNTIME);
          auto* map_key = aux_entry.field->message_type()->map_key();
          auto* map_value = aux_entry.field->message_type()->map_value();
          const bool validated_enum =
              map_value->type() == FieldDescriptor::TYPE_ENUM &&
              !internal::cpp::HasPreservingUnknownEnumSemantics(map_value);
          p->Emit(
              {
                  {"strict", utf8_check == Utf8CheckMode::kStrict},
                  {"verify", utf8_check == Utf8CheckMode::kVerify},
                  {"validate", validated_enum},
                  {"key_wire", map_key->type()},
                  {"value_wire", map_value->type()},
                  {"is_lite",
                   !HasDescriptorMethods(aux_entry.field->file(), options_)},
              },
              R"cc(
                {::_pbi::TcParser::GetMapAuxInfo($strict$, $verify$, $validate$,
                                                 $key_wire$, $value_wire$,
                                                 $is_lite$)},
              )cc");
          break;
        }
      }
    }
  };

  p->Emit(
      {{"const",
        // FileDescriptorProto's table must be constant initialized. For MSVC
        // this means using `constexpr`. However, we can't use `constexpr`
        // for all tables because it breaks when crossing DLL boundaries.
        // FileDescriptorProto is safe from this.
        IsFileDescriptorProto(descriptor_->file(), options_)
            ? "constexpr"
            : "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst"},
       {"table_size_log2", tc_table_info_->table_size_log2},
       {"ordered_size", ordered_fields_.size()},
       {"aux_size", tc_table_info_->aux_entries.size()},
       {"data_size", FieldNameDataSize(tc_table_info_->field_name_data)},
       {"field_num_to_entry_table_size", field_num_to_entry_table.size16()},
       {"table_base", GenerateTableBase},
       {"fast_entries",
        [&] {
          // TODO: refactor this to use Emit.
          Formatter format(p, variables_);
          GenerateFastFieldEntries(format);
        }},
       {"field_lookup_table",
        [&] {
          for (SkipEntryBlock& entry_block : field_num_to_entry_table.blocks) {
            p->Emit(
                {
                    {"lower", entry_block.first_fnum & 65535},
                    {"upper", entry_block.first_fnum / 65536},
                    {"size", entry_block.entries.size()},
                },
                "$lower$, $upper$, $size$,\n");

            for (SkipEntry16 se16 : entry_block.entries) {
              p->Emit({{"skipmap", se16.skipmap},
                       {"offset", se16.field_entry_offset}},
                      R"cc(
                        $skipmap$, $offset$,
                      )cc");
            }
          }

          // The last entry of the skipmap are all 1's.
          p->Emit("65535, 65535\n");
        }},
       {"field_and_aux_entries",
        [&] {
          if (ordered_fields_.empty() &&
              !descriptor_->options().message_set_wire_format()) {
            ABSL_DLOG_IF(FATAL, !tc_table_info_->aux_entries.empty())
                << "Invalid message: " << descriptor_->full_name() << " has "
                << tc_table_info_->aux_entries.size()
                << " auxiliary field entries, but no fields";
            p->Emit("// no field_entries, or aux_entries\n");
            return;
          }

          p->Emit(
              {
                  {"field_entries",
                   [&] {
                     // TODO: refactor this to use Emit.
                     Formatter format(p, variables_);
                     GenerateFieldEntries(format);
                   }},
                  {"aux_entries",
                   [&] {
                     if (tc_table_info_->aux_entries.empty()) {
                       p->Emit("// no aux_entries\n");
                     } else {
                       p->Emit(
                           {
                               {"aux_entries_list", GenerateAuxEntries},
                           },
                           // clang-format off
                              R"cc(
                                {{
                                    $aux_entries_list$
                                }},
                              )cc"
                           // clang-format on
                       );
                     }
                   }},
              },
              // clang-format off
                 R"cc(
                 {{
                   $field_entries$,
                 }},
                 $aux_entries$)cc"
              // clang-format on
          );
        }},
       {"field_names",
        [&] {
          Formatter format(p, variables_);
          GenerateFieldNames(format);
        }}},
      // Disable clang-format, as we want to generate a denser table
      // representation than what clang-format typically wants. clang would
      // insert a newline at every brace, whereas we prefer {{ ... }} here.
      // clang-format off
R"cc(
$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>
$classname$::_table_ = {
  {
    $table_base$
  }, {{
    $fast_entries$
  }}, {{
    $field_lookup_table$
  }}, $field_and_aux_entries$,
  {{
    $field_names$,
  }},
};
)cc"
      // clang-format on
  );
}